

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaNormalTargetGenerator::~cmNinjaNormalTargetGenerator(cmNinjaNormalTargetGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmOSXBundleGenerator *pcVar2;
  pointer pcVar3;
  
  (this->super_cmNinjaTargetGenerator)._vptr_cmNinjaTargetGenerator =
       (_func_int **)&PTR__cmNinjaNormalTargetGenerator_005fc708;
  pcVar2 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
  if (pcVar2 != (cmOSXBundleGenerator *)0x0) {
    pcVar3 = (pcVar2->ConfigName)._M_dataplus._M_p;
    paVar1 = &(pcVar2->ConfigName).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(pcVar2,0x40);
  }
  pcVar3 = (this->TargetLinkLanguage)._M_dataplus._M_p;
  paVar1 = &(this->TargetLinkLanguage).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->TargetNamePDB)._M_dataplus._M_p;
  paVar1 = &(this->TargetNamePDB).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->TargetNameImport)._M_dataplus._M_p;
  paVar1 = &(this->TargetNameImport).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->TargetNameReal)._M_dataplus._M_p;
  paVar1 = &(this->TargetNameReal).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->TargetNameSO)._M_dataplus._M_p;
  paVar1 = &(this->TargetNameSO).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->TargetNameOut)._M_dataplus._M_p;
  paVar1 = &(this->TargetNameOut).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  cmNinjaTargetGenerator::~cmNinjaTargetGenerator(&this->super_cmNinjaTargetGenerator);
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::~cmNinjaNormalTargetGenerator()
{
  delete this->OSXBundleGenerator;
}